

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::CallFinder::~CallFinder(CallFinder *this)

{
  pointer pCVar1;
  pointer pTVar2;
  
  pCVar1 = (this->infos).
           super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->infos).
                                 super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  pTVar2 = (this->
           super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
           ).
           super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                          ).
                                          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pTVar2);
    return;
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    // Add the call as not having a drop, and update the drop later if we are.
    infos.push_back(CallInfo{curr, nullptr});
  }